

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O3

void rhash_sha512_process_block(uint64_t *hash,uint64_t *block)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  
  uVar1 = *hash;
  uVar2 = hash[1];
  uVar3 = hash[2];
  uVar4 = hash[4];
  uVar5 = hash[5];
  uVar6 = hash[6];
  uVar13 = *block;
  local_d8 = uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
             (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8 |
             (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 | (uVar13 & 0xff00) << 0x28 |
             uVar13 << 0x38;
  lVar7 = local_d8 + 0x428a2f98d728ae22 +
          ((uVar6 ^ uVar5) & uVar4 ^ uVar6) + hash[7] +
          ((uVar4 << 0x17 | uVar4 >> 0x29) ^
          (uVar4 << 0x2e | uVar4 >> 0x12) ^ (uVar4 << 0x32 | uVar4 >> 0xe));
  uVar14 = ((uVar2 ^ uVar1) & uVar3 ^ uVar2 & uVar1) +
           ((uVar1 << 0x19 | uVar1 >> 0x27) ^
           (uVar1 << 0x1e | uVar1 >> 0x22) ^ (uVar1 << 0x24 | uVar1 >> 0x1c)) + lVar7;
  uVar8 = lVar7 + hash[3];
  uVar13 = block[1];
  local_e0 = uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
             (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8 |
             (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 | (uVar13 & 0xff00) << 0x28 |
             uVar13 << 0x38;
  lVar7 = ((uVar5 ^ uVar4) & uVar8 ^ uVar5) + local_e0 + uVar6 + 0x7137449123ef65cd +
          ((uVar8 * 0x800000 | uVar8 >> 0x29) ^
          (uVar8 << 0x2e | uVar8 >> 0x12) ^ (uVar8 << 0x32 | uVar8 >> 0xe));
  uVar18 = ((uVar14 ^ uVar1) & uVar2 ^ uVar14 & uVar1) +
           ((uVar14 * 0x2000000 | uVar14 >> 0x27) ^
           (uVar14 * 0x40000000 | uVar14 >> 0x22) ^ (uVar14 << 0x24 | uVar14 >> 0x1c)) + lVar7;
  uVar11 = lVar7 + uVar3;
  uVar13 = block[2];
  local_e8 = uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
             (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8 |
             (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 | (uVar13 & 0xff00) << 0x28 |
             uVar13 << 0x38;
  lVar7 = ((uVar8 ^ uVar4) & uVar11 ^ uVar4) + local_e8 + uVar5 + -0x4a3f043013b2c4d1 +
          ((uVar11 * 0x800000 | uVar11 >> 0x29) ^
          (uVar11 << 0x2e | uVar11 >> 0x12) ^ (uVar11 << 0x32 | uVar11 >> 0xe));
  uVar17 = ((uVar18 ^ uVar14) & uVar1 ^ uVar18 & uVar14) +
           ((uVar18 * 0x2000000 | uVar18 >> 0x27) ^
           (uVar18 * 0x40000000 | uVar18 >> 0x22) ^ (uVar18 << 0x24 | uVar18 >> 0x1c)) + lVar7;
  uVar9 = lVar7 + uVar2;
  uVar13 = block[3];
  local_f0 = uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
             (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8 |
             (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 | (uVar13 & 0xff00) << 0x28 |
             uVar13 << 0x38;
  lVar7 = ((uVar11 ^ uVar8) & uVar9 ^ uVar8) + local_f0 + uVar4 + -0x164a245a7e762444 +
          ((uVar9 * 0x800000 | uVar9 >> 0x29) ^
          (uVar9 << 0x2e | uVar9 >> 0x12) ^ (uVar9 << 0x32 | uVar9 >> 0xe));
  uVar12 = ((uVar17 ^ uVar18) & uVar14 ^ uVar17 & uVar18) +
           ((uVar17 * 0x2000000 | uVar17 >> 0x27) ^
           (uVar17 * 0x40000000 | uVar17 >> 0x22) ^ (uVar17 << 0x24 | uVar17 >> 0x1c)) + lVar7;
  uVar15 = lVar7 + uVar1;
  uVar13 = block[4];
  local_f8 = uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
             (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8 |
             (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 | (uVar13 & 0xff00) << 0x28 |
             uVar13 << 0x38;
  lVar7 = uVar8 + local_f8 + ((uVar9 ^ uVar11) & uVar15 ^ uVar11) + 0x3956c25bf348b538 +
          ((uVar15 * 0x800000 | uVar15 >> 0x29) ^
          (uVar15 << 0x2e | uVar15 >> 0x12) ^ (uVar15 << 0x32 | uVar15 >> 0xe));
  uVar14 = uVar14 + lVar7;
  uVar8 = ((uVar12 ^ uVar17) & uVar18 ^ uVar12 & uVar17) +
          ((uVar12 * 0x2000000 | uVar12 >> 0x27) ^
          (uVar12 * 0x40000000 | uVar12 >> 0x22) ^ (uVar12 << 0x24 | uVar12 >> 0x1c)) + lVar7;
  uVar13 = block[5];
  local_100 = uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
              (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8 |
              (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 | (uVar13 & 0xff00) << 0x28 |
              uVar13 << 0x38;
  lVar7 = uVar11 + local_100 + ((uVar15 ^ uVar9) & uVar14 ^ uVar9) + 0x59f111f1b605d019 +
          ((uVar14 * 0x800000 | uVar14 >> 0x29) ^
          (uVar14 << 0x2e | uVar14 >> 0x12) ^ (uVar14 << 0x32 | uVar14 >> 0xe));
  uVar18 = uVar18 + lVar7;
  uVar11 = ((uVar8 ^ uVar12) & uVar17 ^ uVar8 & uVar12) +
           ((uVar8 * 0x2000000 | uVar8 >> 0x27) ^
           (uVar8 * 0x40000000 | uVar8 >> 0x22) ^ (uVar8 << 0x24 | uVar8 >> 0x1c)) + lVar7;
  uVar13 = block[6];
  local_118 = uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
              (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8 |
              (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 | (uVar13 & 0xff00) << 0x28 |
              uVar13 << 0x38;
  lVar7 = uVar9 + local_118 + ((uVar14 ^ uVar15) & uVar18 ^ uVar15) + -0x6dc07d5b50e6b065 +
          ((uVar18 * 0x800000 | uVar18 >> 0x29) ^
          (uVar18 << 0x2e | uVar18 >> 0x12) ^ (uVar18 << 0x32 | uVar18 >> 0xe));
  uVar17 = uVar17 + lVar7;
  uVar9 = ((uVar11 ^ uVar8) & uVar12 ^ uVar11 & uVar8) +
          ((uVar11 * 0x2000000 | uVar11 >> 0x27) ^
          (uVar11 * 0x40000000 | uVar11 >> 0x22) ^ (uVar11 << 0x24 | uVar11 >> 0x1c)) + lVar7;
  uVar13 = block[7];
  local_110 = uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
              (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8 |
              (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 | (uVar13 & 0xff00) << 0x28 |
              uVar13 << 0x38;
  lVar7 = uVar15 + local_110 + ((uVar18 ^ uVar14) & uVar17 ^ uVar14) + -0x54e3a12a25927ee8 +
          ((uVar17 * 0x800000 | uVar17 >> 0x29) ^
          (uVar17 << 0x2e | uVar17 >> 0x12) ^ (uVar17 << 0x32 | uVar17 >> 0xe));
  uVar12 = uVar12 + lVar7;
  uVar16 = ((uVar9 ^ uVar11) & uVar8 ^ uVar9 & uVar11) +
           ((uVar9 * 0x2000000 | uVar9 >> 0x27) ^
           (uVar9 * 0x40000000 | uVar9 >> 0x22) ^ (uVar9 << 0x24 | uVar9 >> 0x1c)) + lVar7;
  uVar13 = block[8];
  local_108 = uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
              (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8 |
              (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 | (uVar13 & 0xff00) << 0x28 |
              uVar13 << 0x38;
  lVar7 = uVar14 + local_108 + ((uVar17 ^ uVar18) & uVar12 ^ uVar18) + -0x27f855675cfcfdbe +
          ((uVar12 * 0x800000 | uVar12 >> 0x29) ^
          (uVar12 << 0x2e | uVar12 >> 0x12) ^ (uVar12 << 0x32 | uVar12 >> 0xe));
  uVar8 = uVar8 + lVar7;
  uVar15 = ((uVar16 ^ uVar9) & uVar11 ^ uVar16 & uVar9) +
           ((uVar16 * 0x2000000 | uVar16 >> 0x27) ^
           (uVar16 * 0x40000000 | uVar16 >> 0x22) ^ (uVar16 << 0x24 | uVar16 >> 0x1c)) + lVar7;
  uVar13 = block[9];
  local_120 = uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
              (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8 |
              (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 | (uVar13 & 0xff00) << 0x28 |
              uVar13 << 0x38;
  lVar7 = uVar18 + local_120 + ((uVar12 ^ uVar17) & uVar8 ^ uVar17) + 0x12835b0145706fbe +
          ((uVar8 * 0x800000 | uVar8 >> 0x29) ^
          (uVar8 << 0x2e | uVar8 >> 0x12) ^ (uVar8 << 0x32 | uVar8 >> 0xe));
  uVar11 = uVar11 + lVar7;
  uVar18 = ((uVar15 ^ uVar16) & uVar9 ^ uVar15 & uVar16) +
           ((uVar15 * 0x2000000 | uVar15 >> 0x27) ^
           (uVar15 * 0x40000000 | uVar15 >> 0x22) ^ (uVar15 << 0x24 | uVar15 >> 0x1c)) + lVar7;
  uVar13 = block[10];
  local_128 = uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
              (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8 |
              (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 | (uVar13 & 0xff00) << 0x28 |
              uVar13 << 0x38;
  lVar7 = uVar17 + local_128 + ((uVar8 ^ uVar12) & uVar11 ^ uVar12) + 0x243185be4ee4b28c +
          ((uVar11 * 0x800000 | uVar11 >> 0x29) ^
          (uVar11 << 0x2e | uVar11 >> 0x12) ^ (uVar11 << 0x32 | uVar11 >> 0xe));
  uVar9 = uVar9 + lVar7;
  uVar14 = ((uVar18 ^ uVar15) & uVar16 ^ uVar18 & uVar15) +
           ((uVar18 * 0x2000000 | uVar18 >> 0x27) ^
           (uVar18 * 0x40000000 | uVar18 >> 0x22) ^ (uVar18 << 0x24 | uVar18 >> 0x1c)) + lVar7;
  uVar13 = block[0xb];
  local_130 = uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
              (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8 |
              (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 | (uVar13 & 0xff00) << 0x28 |
              uVar13 << 0x38;
  lVar7 = uVar12 + local_130 + ((uVar11 ^ uVar8) & uVar9 ^ uVar8) + 0x550c7dc3d5ffb4e2 +
          ((uVar9 * 0x800000 | uVar9 >> 0x29) ^
          (uVar9 << 0x2e | uVar9 >> 0x12) ^ (uVar9 << 0x32 | uVar9 >> 0xe));
  uVar16 = uVar16 + lVar7;
  uVar17 = ((uVar14 ^ uVar18) & uVar15 ^ uVar14 & uVar18) +
           ((uVar14 * 0x2000000 | uVar14 >> 0x27) ^
           (uVar14 * 0x40000000 | uVar14 >> 0x22) ^ (uVar14 << 0x24 | uVar14 >> 0x1c)) + lVar7;
  uVar13 = block[0xc];
  local_168 = uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
              (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8 |
              (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 | (uVar13 & 0xff00) << 0x28 |
              uVar13 << 0x38;
  lVar7 = uVar8 + local_168 + ((uVar9 ^ uVar11) & uVar16 ^ uVar11) + 0x72be5d74f27b896f +
          ((uVar16 * 0x800000 | uVar16 >> 0x29) ^
          (uVar16 << 0x2e | uVar16 >> 0x12) ^ (uVar16 << 0x32 | uVar16 >> 0xe));
  uVar15 = uVar15 + lVar7;
  uVar12 = ((uVar17 ^ uVar14) & uVar18 ^ uVar17 & uVar14) +
           ((uVar17 * 0x2000000 | uVar17 >> 0x27) ^
           (uVar17 * 0x40000000 | uVar17 >> 0x22) ^ (uVar17 << 0x24 | uVar17 >> 0x1c)) + lVar7;
  uVar13 = block[0xd];
  local_160 = uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
              (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8 |
              (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 | (uVar13 & 0xff00) << 0x28 |
              uVar13 << 0x38;
  lVar7 = uVar11 + local_160 + ((uVar16 ^ uVar9) & uVar15 ^ uVar9) + -0x7f214e01c4e9694f +
          ((uVar15 * 0x800000 | uVar15 >> 0x29) ^
          (uVar15 << 0x2e | uVar15 >> 0x12) ^ (uVar15 << 0x32 | uVar15 >> 0xe));
  uVar18 = uVar18 + lVar7;
  uVar11 = ((uVar12 ^ uVar17) & uVar14 ^ uVar12 & uVar17) +
           ((uVar12 * 0x2000000 | uVar12 >> 0x27) ^
           (uVar12 * 0x40000000 | uVar12 >> 0x22) ^ (uVar12 << 0x24 | uVar12 >> 0x1c)) + lVar7;
  uVar13 = block[0xe];
  uVar8 = uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 | (uVar13 & 0xff0000000000) >> 0x18 |
          (uVar13 & 0xff00000000) >> 8 | (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 |
          (uVar13 & 0xff00) << 0x28 | uVar13 << 0x38;
  lVar7 = uVar9 + uVar8 + ((uVar15 ^ uVar16) & uVar18 ^ uVar16) + -0x6423f958da38edcb +
          ((uVar18 * 0x800000 | uVar18 >> 0x29) ^
          (uVar18 << 0x2e | uVar18 >> 0x12) ^ (uVar18 << 0x32 | uVar18 >> 0xe));
  uVar14 = uVar14 + lVar7;
  uVar9 = ((uVar11 ^ uVar12) & uVar17 ^ uVar11 & uVar12) +
          ((uVar11 * 0x2000000 | uVar11 >> 0x27) ^
          (uVar11 * 0x40000000 | uVar11 >> 0x22) ^ (uVar11 << 0x24 | uVar11 >> 0x1c)) + lVar7;
  uVar13 = block[0xf];
  local_170 = uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
              (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8 |
              (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 | (uVar13 & 0xff00) << 0x28 |
              uVar13 << 0x38;
  lVar7 = uVar16 + local_170 + ((uVar18 ^ uVar15) & uVar14 ^ uVar15) + -0x3e640e8b3096d96c +
          ((uVar14 * 0x800000 | uVar14 >> 0x29) ^
          (uVar14 << 0x2e | uVar14 >> 0x12) ^ (uVar14 << 0x32 | uVar14 >> 0xe));
  uVar17 = uVar17 + lVar7;
  uVar13 = ((uVar9 ^ uVar11) & uVar12 ^ uVar9 & uVar11) +
           ((uVar9 * 0x2000000 | uVar9 >> 0x27) ^
           (uVar9 * 0x40000000 | uVar9 >> 0x22) ^ (uVar9 << 0x24 | uVar9 >> 0x1c)) + lVar7;
  lVar7 = 0;
  do {
    local_d8 = local_d8 + local_120 +
               (local_e0 >> 7 ^
               (local_e0 << 0x38 | local_e0 >> 8) ^
               (local_e0 >> 1 | (ulong)((local_e0 & 1) != 0) << 0x3f)) +
               (uVar8 >> 6 ^ (uVar8 << 3 | uVar8 >> 0x3d) ^ (uVar8 << 0x2d | uVar8 >> 0x13));
    lVar10 = ((uVar14 ^ uVar18) & uVar17 ^ uVar18) + uVar15 +
             ((uVar17 << 0x17 | uVar17 >> 0x29) ^
             (uVar17 << 0x2e | uVar17 >> 0x12) ^ (uVar17 << 0x32 | uVar17 >> 0xe)) + local_d8 +
             rhash_k512[lVar7 + 0x10];
    uVar12 = uVar12 + lVar10;
    uVar15 = ((uVar13 ^ uVar9) & uVar11 ^ uVar13 & uVar9) +
             ((uVar13 << 0x19 | uVar13 >> 0x27) ^
             (uVar13 << 0x1e | uVar13 >> 0x22) ^ (uVar13 << 0x24 | uVar13 >> 0x1c)) + lVar10;
    local_e0 = local_e0 + local_128 +
               (local_e8 >> 7 ^
               (local_e8 << 0x38 | local_e8 >> 8) ^
               (local_e8 >> 1 | (ulong)((local_e8 & 1) != 0) << 0x3f)) +
               (local_170 >> 6 ^
               (local_170 << 3 | local_170 >> 0x3d) ^ (local_170 << 0x2d | local_170 >> 0x13));
    lVar10 = uVar18 + local_e0 + rhash_k512[lVar7 + 0x11] + ((uVar17 ^ uVar14) & uVar12 ^ uVar14) +
             ((uVar12 * 0x800000 | uVar12 >> 0x29) ^
             (uVar12 << 0x2e | uVar12 >> 0x12) ^ (uVar12 << 0x32 | uVar12 >> 0xe));
    uVar11 = uVar11 + lVar10;
    uVar18 = ((uVar15 ^ uVar13) & uVar9 ^ uVar15 & uVar13) +
             ((uVar15 * 0x2000000 | uVar15 >> 0x27) ^
             (uVar15 * 0x40000000 | uVar15 >> 0x22) ^ (uVar15 << 0x24 | uVar15 >> 0x1c)) + lVar10;
    local_e8 = local_e8 + local_130 +
               (local_f0 >> 7 ^
               (local_f0 << 0x38 | local_f0 >> 8) ^
               (local_f0 >> 1 | (ulong)((local_f0 & 1) != 0) << 0x3f)) +
               (local_d8 >> 6 ^
               (local_d8 * 8 | local_d8 >> 0x3d) ^ (local_d8 << 0x2d | local_d8 >> 0x13));
    lVar10 = uVar14 + local_e8 + rhash_k512[lVar7 + 0x12] + ((uVar12 ^ uVar17) & uVar11 ^ uVar17) +
             ((uVar11 * 0x800000 | uVar11 >> 0x29) ^
             (uVar11 << 0x2e | uVar11 >> 0x12) ^ (uVar11 << 0x32 | uVar11 >> 0xe));
    uVar9 = uVar9 + lVar10;
    uVar14 = ((uVar18 ^ uVar15) & uVar13 ^ uVar18 & uVar15) +
             ((uVar18 * 0x2000000 | uVar18 >> 0x27) ^
             (uVar18 * 0x40000000 | uVar18 >> 0x22) ^ (uVar18 << 0x24 | uVar18 >> 0x1c)) + lVar10;
    local_f0 = local_f0 + local_168 +
               (local_f8 >> 7 ^
               (local_f8 << 0x38 | local_f8 >> 8) ^
               (local_f8 >> 1 | (ulong)((local_f8 & 1) != 0) << 0x3f)) +
               (local_e0 >> 6 ^
               (local_e0 * 8 | local_e0 >> 0x3d) ^ (local_e0 << 0x2d | local_e0 >> 0x13));
    lVar10 = uVar17 + local_f0 + rhash_k512[lVar7 + 0x13] + ((uVar11 ^ uVar12) & uVar9 ^ uVar12) +
             ((uVar9 * 0x800000 | uVar9 >> 0x29) ^
             (uVar9 << 0x2e | uVar9 >> 0x12) ^ (uVar9 << 0x32 | uVar9 >> 0xe));
    uVar13 = uVar13 + lVar10;
    uVar16 = ((uVar14 ^ uVar18) & uVar15 ^ uVar14 & uVar18) +
             ((uVar14 * 0x2000000 | uVar14 >> 0x27) ^
             (uVar14 * 0x40000000 | uVar14 >> 0x22) ^ (uVar14 << 0x24 | uVar14 >> 0x1c)) + lVar10;
    local_f8 = local_f8 + local_160 +
               (local_100 >> 7 ^
               (local_100 << 0x38 | local_100 >> 8) ^
               (local_100 >> 1 | (ulong)((local_100 & 1) != 0) << 0x3f)) +
               (local_e8 >> 6 ^
               (local_e8 * 8 | local_e8 >> 0x3d) ^ (local_e8 << 0x2d | local_e8 >> 0x13));
    lVar10 = uVar12 + local_f8 + rhash_k512[lVar7 + 0x14] + ((uVar9 ^ uVar11) & uVar13 ^ uVar11) +
             ((uVar13 * 0x800000 | uVar13 >> 0x29) ^
             (uVar13 << 0x2e | uVar13 >> 0x12) ^ (uVar13 << 0x32 | uVar13 >> 0xe));
    uVar15 = uVar15 + lVar10;
    uVar12 = ((uVar16 ^ uVar14) & uVar18 ^ uVar16 & uVar14) +
             ((uVar16 * 0x2000000 | uVar16 >> 0x27) ^
             (uVar16 * 0x40000000 | uVar16 >> 0x22) ^ (uVar16 << 0x24 | uVar16 >> 0x1c)) + lVar10;
    local_100 = local_100 + uVar8 +
                (local_118 >> 7 ^
                (local_118 << 0x38 | local_118 >> 8) ^
                (local_118 >> 1 | (ulong)((local_118 & 1) != 0) << 0x3f)) +
                (local_f0 >> 6 ^
                (local_f0 * 8 | local_f0 >> 0x3d) ^ (local_f0 << 0x2d | local_f0 >> 0x13));
    lVar10 = rhash_k512[lVar7 + 0x15] + local_100 + uVar11 + ((uVar13 ^ uVar9) & uVar15 ^ uVar9) +
             ((uVar15 * 0x800000 | uVar15 >> 0x29) ^
             (uVar15 << 0x2e | uVar15 >> 0x12) ^ (uVar15 << 0x32 | uVar15 >> 0xe));
    local_118 = local_118 + local_170 +
                (local_110 >> 7 ^
                (local_110 << 0x38 | local_110 >> 8) ^
                (local_110 >> 1 | (ulong)((local_110 & 1) != 0) << 0x3f)) +
                (local_f8 >> 6 ^
                (local_f8 * 8 | local_f8 >> 0x3d) ^ (local_f8 << 0x2d | local_f8 >> 0x13));
    uVar18 = uVar18 + lVar10;
    uVar11 = ((uVar12 ^ uVar16) & uVar14 ^ uVar12 & uVar16) +
             ((uVar12 * 0x2000000 | uVar12 >> 0x27) ^
             (uVar12 * 0x40000000 | uVar12 >> 0x22) ^ (uVar12 << 0x24 | uVar12 >> 0x1c)) + lVar10;
    lVar10 = rhash_k512[lVar7 + 0x16] + local_118 + uVar9 + ((uVar15 ^ uVar13) & uVar18 ^ uVar13) +
             ((uVar18 * 0x800000 | uVar18 >> 0x29) ^
             (uVar18 << 0x2e | uVar18 >> 0x12) ^ (uVar18 << 0x32 | uVar18 >> 0xe));
    local_110 = (local_108 >> 7 ^
                (local_108 << 0x38 | local_108 >> 8) ^
                (local_108 >> 1 | (ulong)((local_108 & 1) != 0) << 0x3f)) + local_110 + local_d8 +
                (local_100 >> 6 ^
                (local_100 * 8 | local_100 >> 0x3d) ^ (local_100 << 0x2d | local_100 >> 0x13));
    uVar14 = uVar14 + lVar10;
    uVar9 = ((uVar11 ^ uVar12) & uVar16 ^ uVar11 & uVar12) +
            ((uVar11 * 0x2000000 | uVar11 >> 0x27) ^
            (uVar11 * 0x40000000 | uVar11 >> 0x22) ^ (uVar11 << 0x24 | uVar11 >> 0x1c)) + lVar10;
    lVar10 = rhash_k512[lVar7 + 0x17] + local_110 + uVar13 + ((uVar18 ^ uVar15) & uVar14 ^ uVar15) +
             ((uVar14 * 0x800000 | uVar14 >> 0x29) ^
             (uVar14 << 0x2e | uVar14 >> 0x12) ^ (uVar14 << 0x32 | uVar14 >> 0xe));
    local_108 = (local_120 >> 7 ^
                (local_120 << 0x38 | local_120 >> 8) ^
                (local_120 >> 1 | (ulong)((local_120 & 1) != 0) << 0x3f)) + local_108 + local_e0 +
                (local_118 >> 6 ^
                (local_118 * 8 | local_118 >> 0x3d) ^ (local_118 << 0x2d | local_118 >> 0x13));
    uVar16 = uVar16 + lVar10;
    uVar13 = ((uVar9 ^ uVar11) & uVar12 ^ uVar9 & uVar11) +
             ((uVar9 * 0x2000000 | uVar9 >> 0x27) ^
             (uVar9 * 0x40000000 | uVar9 >> 0x22) ^ (uVar9 << 0x24 | uVar9 >> 0x1c)) + lVar10;
    lVar10 = rhash_k512[lVar7 + 0x18] + local_108 + uVar15 + ((uVar14 ^ uVar18) & uVar16 ^ uVar18) +
             ((uVar16 * 0x800000 | uVar16 >> 0x29) ^
             (uVar16 << 0x2e | uVar16 >> 0x12) ^ (uVar16 << 0x32 | uVar16 >> 0xe));
    local_120 = (local_128 >> 7 ^
                (local_128 << 0x38 | local_128 >> 8) ^
                (local_128 >> 1 | (ulong)((local_128 & 1) != 0) << 0x3f)) + local_120 + local_e8 +
                (local_110 >> 6 ^
                (local_110 * 8 | local_110 >> 0x3d) ^ (local_110 << 0x2d | local_110 >> 0x13));
    uVar12 = uVar12 + lVar10;
    uVar15 = ((uVar13 ^ uVar9) & uVar11 ^ uVar13 & uVar9) +
             ((uVar13 * 0x2000000 | uVar13 >> 0x27) ^
             (uVar13 * 0x40000000 | uVar13 >> 0x22) ^ (uVar13 << 0x24 | uVar13 >> 0x1c)) + lVar10;
    lVar10 = rhash_k512[lVar7 + 0x19] + local_120 + uVar18 + ((uVar16 ^ uVar14) & uVar12 ^ uVar14) +
             ((uVar12 * 0x800000 | uVar12 >> 0x29) ^
             (uVar12 << 0x2e | uVar12 >> 0x12) ^ (uVar12 << 0x32 | uVar12 >> 0xe));
    local_128 = (local_130 >> 7 ^
                (local_130 << 0x38 | local_130 >> 8) ^
                (local_130 >> 1 | (ulong)((local_130 & 1) != 0) << 0x3f)) + local_128 + local_f0 +
                (local_108 >> 6 ^
                (local_108 * 8 | local_108 >> 0x3d) ^ (local_108 << 0x2d | local_108 >> 0x13));
    uVar11 = uVar11 + lVar10;
    uVar18 = ((uVar15 ^ uVar13) & uVar9 ^ uVar15 & uVar13) +
             ((uVar15 * 0x2000000 | uVar15 >> 0x27) ^
             (uVar15 * 0x40000000 | uVar15 >> 0x22) ^ (uVar15 << 0x24 | uVar15 >> 0x1c)) + lVar10;
    lVar10 = rhash_k512[lVar7 + 0x1a] + local_128 + uVar14 + ((uVar12 ^ uVar16) & uVar11 ^ uVar16) +
             ((uVar11 * 0x800000 | uVar11 >> 0x29) ^
             (uVar11 << 0x2e | uVar11 >> 0x12) ^ (uVar11 << 0x32 | uVar11 >> 0xe));
    local_130 = (local_168 >> 7 ^
                (local_168 << 0x38 | local_168 >> 8) ^
                (local_168 >> 1 | (ulong)((local_168 & 1) != 0) << 0x3f)) + local_130 + local_f8 +
                (local_120 >> 6 ^
                (local_120 * 8 | local_120 >> 0x3d) ^ (local_120 << 0x2d | local_120 >> 0x13));
    uVar9 = uVar9 + lVar10;
    uVar14 = ((uVar18 ^ uVar15) & uVar13 ^ uVar18 & uVar15) +
             ((uVar18 * 0x2000000 | uVar18 >> 0x27) ^
             (uVar18 * 0x40000000 | uVar18 >> 0x22) ^ (uVar18 << 0x24 | uVar18 >> 0x1c)) + lVar10;
    lVar10 = rhash_k512[lVar7 + 0x1b] + local_130 + uVar16 + ((uVar11 ^ uVar12) & uVar9 ^ uVar12) +
             ((uVar9 * 0x800000 | uVar9 >> 0x29) ^
             (uVar9 << 0x2e | uVar9 >> 0x12) ^ (uVar9 << 0x32 | uVar9 >> 0xe));
    local_168 = (local_160 >> 7 ^
                (local_160 << 0x38 | local_160 >> 8) ^
                (local_160 >> 1 | (ulong)((local_160 & 1) != 0) << 0x3f)) + local_168 + local_100 +
                (local_128 >> 6 ^
                (local_128 * 8 | local_128 >> 0x3d) ^ (local_128 << 0x2d | local_128 >> 0x13));
    uVar13 = uVar13 + lVar10;
    uVar17 = ((uVar14 ^ uVar18) & uVar15 ^ uVar14 & uVar18) +
             ((uVar14 * 0x2000000 | uVar14 >> 0x27) ^
             (uVar14 * 0x40000000 | uVar14 >> 0x22) ^ (uVar14 << 0x24 | uVar14 >> 0x1c)) + lVar10;
    lVar10 = rhash_k512[lVar7 + 0x1c] + local_168 + uVar12 + ((uVar9 ^ uVar11) & uVar13 ^ uVar11) +
             ((uVar13 * 0x800000 | uVar13 >> 0x29) ^
             (uVar13 << 0x2e | uVar13 >> 0x12) ^ (uVar13 << 0x32 | uVar13 >> 0xe));
    local_160 = (uVar8 >> 7 ^
                (uVar8 << 0x38 | uVar8 >> 8) ^ (uVar8 >> 1 | (ulong)((uVar8 & 1) != 0) << 0x3f)) +
                local_160 + local_118 +
                (local_130 >> 6 ^
                (local_130 * 8 | local_130 >> 0x3d) ^ (local_130 << 0x2d | local_130 >> 0x13));
    uVar15 = uVar15 + lVar10;
    uVar12 = ((uVar17 ^ uVar14) & uVar18 ^ uVar17 & uVar14) +
             ((uVar17 * 0x2000000 | uVar17 >> 0x27) ^
             (uVar17 * 0x40000000 | uVar17 >> 0x22) ^ (uVar17 << 0x24 | uVar17 >> 0x1c)) + lVar10;
    lVar10 = rhash_k512[lVar7 + 0x1d] + local_160 + uVar11 + ((uVar13 ^ uVar9) & uVar15 ^ uVar9) +
             ((uVar15 * 0x800000 | uVar15 >> 0x29) ^
             (uVar15 << 0x2e | uVar15 >> 0x12) ^ (uVar15 << 0x32 | uVar15 >> 0xe));
    uVar8 = (local_170 >> 7 ^
            (local_170 << 0x38 | local_170 >> 8) ^
            (local_170 >> 1 | (ulong)((local_170 & 1) != 0) << 0x3f)) + uVar8 + local_110 +
            (local_168 >> 6 ^
            (local_168 * 8 | local_168 >> 0x3d) ^ (local_168 << 0x2d | local_168 >> 0x13));
    uVar18 = uVar18 + lVar10;
    uVar11 = ((uVar12 ^ uVar17) & uVar14 ^ uVar12 & uVar17) +
             ((uVar12 * 0x2000000 | uVar12 >> 0x27) ^
             (uVar12 * 0x40000000 | uVar12 >> 0x22) ^ (uVar12 << 0x24 | uVar12 >> 0x1c)) + lVar10;
    lVar10 = rhash_k512[lVar7 + 0x1e] + uVar8 + uVar9 + ((uVar15 ^ uVar13) & uVar18 ^ uVar13) +
             ((uVar18 * 0x800000 | uVar18 >> 0x29) ^
             (uVar18 << 0x2e | uVar18 >> 0x12) ^ (uVar18 << 0x32 | uVar18 >> 0xe));
    local_170 = (local_d8 >> 7 ^
                (local_d8 << 0x38 | local_d8 >> 8) ^
                (local_d8 >> 1 | (ulong)((local_d8 & 1) != 0) << 0x3f)) + local_170 + local_108 +
                (local_160 >> 6 ^
                (local_160 * 8 | local_160 >> 0x3d) ^ (local_160 << 0x2d | local_160 >> 0x13));
    uVar14 = uVar14 + lVar10;
    uVar9 = ((uVar11 ^ uVar12) & uVar17 ^ uVar11 & uVar12) +
            ((uVar11 * 0x2000000 | uVar11 >> 0x27) ^
            (uVar11 * 0x40000000 | uVar11 >> 0x22) ^ (uVar11 << 0x24 | uVar11 >> 0x1c)) + lVar10;
    lVar10 = rhash_k512[lVar7 + 0x1f] + local_170 + uVar13 + ((uVar18 ^ uVar15) & uVar14 ^ uVar15) +
             ((uVar14 * 0x800000 | uVar14 >> 0x29) ^
             (uVar14 << 0x2e | uVar14 >> 0x12) ^ (uVar14 << 0x32 | uVar14 >> 0xe));
    uVar17 = uVar17 + lVar10;
    uVar13 = ((uVar9 ^ uVar11) & uVar12 ^ uVar9 & uVar11) +
             ((uVar9 * 0x2000000 | uVar9 >> 0x27) ^
             (uVar9 * 0x40000000 | uVar9 >> 0x22) ^ (uVar9 << 0x24 | uVar9 >> 0x1c)) + lVar10;
    lVar7 = lVar7 + 0x10;
  } while ((uint)lVar7 < 0x40);
  *hash = uVar13 + uVar1;
  hash[1] = uVar9 + uVar2;
  hash[2] = uVar11 + uVar3;
  hash[3] = uVar12 + hash[3];
  hash[4] = uVar17 + uVar4;
  hash[5] = uVar14 + uVar5;
  hash[6] = uVar18 + uVar6;
  hash[7] = uVar15 + hash[7];
  return;
}

Assistant:

static void rhash_sha512_process_block(uint64_t hash[8], uint64_t block[16])
{
	uint64_t A, B, C, D, E, F, G, H;
	uint64_t W[16];
	const uint64_t *k;
	int i;

	A = hash[0], B = hash[1], C = hash[2], D = hash[3];
	E = hash[4], F = hash[5], G = hash[6], H = hash[7];

	/* Compute SHA using alternate Method: FIPS 180-3 6.1.3 */
	ROUND_1_16(A, B, C, D, E, F, G, H, 0);
	ROUND_1_16(H, A, B, C, D, E, F, G, 1);
	ROUND_1_16(G, H, A, B, C, D, E, F, 2);
	ROUND_1_16(F, G, H, A, B, C, D, E, 3);
	ROUND_1_16(E, F, G, H, A, B, C, D, 4);
	ROUND_1_16(D, E, F, G, H, A, B, C, 5);
	ROUND_1_16(C, D, E, F, G, H, A, B, 6);
	ROUND_1_16(B, C, D, E, F, G, H, A, 7);
	ROUND_1_16(A, B, C, D, E, F, G, H, 8);
	ROUND_1_16(H, A, B, C, D, E, F, G, 9);
	ROUND_1_16(G, H, A, B, C, D, E, F, 10);
	ROUND_1_16(F, G, H, A, B, C, D, E, 11);
	ROUND_1_16(E, F, G, H, A, B, C, D, 12);
	ROUND_1_16(D, E, F, G, H, A, B, C, 13);
	ROUND_1_16(C, D, E, F, G, H, A, B, 14);
	ROUND_1_16(B, C, D, E, F, G, H, A, 15);

	for (i = 16, k = &rhash_k512[16]; i < 80; i += 16, k += 16) {
		ROUND_17_80(A, B, C, D, E, F, G, H,  0);
		ROUND_17_80(H, A, B, C, D, E, F, G,  1);
		ROUND_17_80(G, H, A, B, C, D, E, F,  2);
		ROUND_17_80(F, G, H, A, B, C, D, E,  3);
		ROUND_17_80(E, F, G, H, A, B, C, D,  4);
		ROUND_17_80(D, E, F, G, H, A, B, C,  5);
		ROUND_17_80(C, D, E, F, G, H, A, B,  6);
		ROUND_17_80(B, C, D, E, F, G, H, A,  7);
		ROUND_17_80(A, B, C, D, E, F, G, H,  8);
		ROUND_17_80(H, A, B, C, D, E, F, G,  9);
		ROUND_17_80(G, H, A, B, C, D, E, F, 10);
		ROUND_17_80(F, G, H, A, B, C, D, E, 11);
		ROUND_17_80(E, F, G, H, A, B, C, D, 12);
		ROUND_17_80(D, E, F, G, H, A, B, C, 13);
		ROUND_17_80(C, D, E, F, G, H, A, B, 14);
		ROUND_17_80(B, C, D, E, F, G, H, A, 15);
	}

	hash[0] += A, hash[1] += B, hash[2] += C, hash[3] += D;
	hash[4] += E, hash[5] += F, hash[6] += G, hash[7] += H;
}